

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_exhaustive.c
# Opt level: O0

void test_exhaustive_sign(secp256k1_context *ctx,secp256k1_ge *group)

{
  int iVar1;
  int iVar2;
  uchar msg32 [32];
  uchar sk32 [32];
  secp256k1_scalar expected_r;
  secp256k1_scalar s;
  secp256k1_scalar r;
  secp256k1_scalar msg;
  secp256k1_scalar sk;
  secp256k1_ecdsa_signature sig;
  int ret;
  int starting_k;
  uint64_t iter;
  int k;
  int j;
  int i;
  undefined4 in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  uint in_stack_ffffffffffffff30;
  undefined3 uVar3;
  undefined4 in_stack_ffffffffffffff34;
  secp256k1_scalar *in_stack_ffffffffffffff38;
  secp256k1_context *in_stack_ffffffffffffff40;
  secp256k1_nonce_function in_stack_ffffffffffffff48;
  uchar *in_stack_ffffffffffffff50;
  uchar *in_stack_ffffffffffffff58;
  secp256k1_ecdsa_signature *in_stack_ffffffffffffff60;
  secp256k1_context *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int local_80;
  int in_stack_ffffffffffffff84;
  secp256k1_ge *in_stack_ffffffffffffff88;
  secp256k1_scalar *in_stack_ffffffffffffff90;
  uint64_t local_28;
  int local_1c;
  int local_18;
  int local_14;
  
  local_28 = 0;
  local_14 = 1;
  do {
    if (0xc < local_14) {
      return;
    }
    for (local_18 = 1; local_18 < 0xd; local_18 = local_18 + 1) {
      iVar1 = skip_section(&local_28);
      if (iVar1 == 0) {
        for (local_1c = 1; iVar1 = local_1c, local_1c < 0xd; local_1c = local_1c + 1) {
          secp256k1_scalar_set_int
                    ((secp256k1_scalar *)
                     CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     in_stack_ffffffffffffff2c);
          secp256k1_scalar_set_int
                    ((secp256k1_scalar *)
                     CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     in_stack_ffffffffffffff2c);
          secp256k1_scalar_get_b32
                    ((uchar *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     (secp256k1_scalar *)
                     CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
          secp256k1_scalar_get_b32
                    ((uchar *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     (secp256k1_scalar *)
                     CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
          iVar2 = secp256k1_ecdsa_sign
                            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                             in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                             in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
          if (iVar2 != 1) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
                    ,0x135,"test condition failed: ret == 1");
            abort();
          }
          secp256k1_ecdsa_signature_load
                    (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                     (secp256k1_scalar *)
                     CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     (secp256k1_ecdsa_signature *)
                     CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
          r_from_k(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                   (int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          if (in_stack_ffffffffffffff84 != in_stack_ffffffffffffff7c) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
                    ,0x13c,"test condition failed: r == expected_r");
            abort();
          }
          in_stack_ffffffffffffff30 = (uint)(local_1c * local_80) % 0xd;
          uVar3 = (undefined3)in_stack_ffffffffffffff34;
          in_stack_ffffffffffffff34 = CONCAT13(1,uVar3);
          if (in_stack_ffffffffffffff30 !=
              (uint)(local_14 + in_stack_ffffffffffffff84 * local_18) % 0xd) {
            in_stack_ffffffffffffff2c = (uint)(local_1c * (0xd - local_80)) % 0xd;
            in_stack_ffffffffffffff34 =
                 CONCAT13(in_stack_ffffffffffffff2c ==
                          (uint)(local_14 + in_stack_ffffffffffffff84 * local_18) % 0xd,uVar3);
          }
          if ((((byte)((uint)in_stack_ffffffffffffff34 >> 0x18) ^ 0xff) & 1) != 0) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
                    ,0x13e,
                    "test condition failed: (k * s) % EXHAUSTIVE_TEST_ORDER == (i + r * j) % EXHAUSTIVE_TEST_ORDER || (k * (EXHAUSTIVE_TEST_ORDER - s)) % EXHAUSTIVE_TEST_ORDER == (i + r * j) % EXHAUSTIVE_TEST_ORDER"
                   );
            abort();
          }
          if (local_1c < iVar1) break;
        }
      }
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

static void test_exhaustive_sign(const secp256k1_context *ctx, const secp256k1_ge *group) {
    int i, j, k;
    uint64_t iter = 0;

    /* Loop */
    for (i = 1; i < EXHAUSTIVE_TEST_ORDER; i++) {  /* message */
        for (j = 1; j < EXHAUSTIVE_TEST_ORDER; j++) {  /* key */
            if (skip_section(&iter)) continue;
            for (k = 1; k < EXHAUSTIVE_TEST_ORDER; k++) {  /* nonce */
                const int starting_k = k;
                int ret;
                secp256k1_ecdsa_signature sig;
                secp256k1_scalar sk, msg, r, s, expected_r;
                unsigned char sk32[32], msg32[32];
                secp256k1_scalar_set_int(&msg, i);
                secp256k1_scalar_set_int(&sk, j);
                secp256k1_scalar_get_b32(sk32, &sk);
                secp256k1_scalar_get_b32(msg32, &msg);

                ret = secp256k1_ecdsa_sign(ctx, &sig, msg32, sk32, secp256k1_nonce_function_smallint, &k);
                CHECK(ret == 1);

                secp256k1_ecdsa_signature_load(ctx, &r, &s, &sig);
                /* Note that we compute expected_r *after* signing -- this is important
                 * because our nonce-computing function function might change k during
                 * signing. */
                r_from_k(&expected_r, group, k, NULL);
                CHECK(r == expected_r);
                CHECK((k * s) % EXHAUSTIVE_TEST_ORDER == (i + r * j) % EXHAUSTIVE_TEST_ORDER ||
                      (k * (EXHAUSTIVE_TEST_ORDER - s)) % EXHAUSTIVE_TEST_ORDER == (i + r * j) % EXHAUSTIVE_TEST_ORDER);

                /* Overflow means we've tried every possible nonce */
                if (k < starting_k) {
                    break;
                }
            }
        }
    }

    /* We would like to verify zero-knowledge here by counting how often every
     * possible (s, r) tuple appears, but because the group order is larger
     * than the field order, when coercing the x-values to scalar values, some
     * appear more often than others, so we are actually not zero-knowledge.
     * (This effect also appears in the real code, but the difference is on the
     * order of 1/2^128th the field order, so the deviation is not useful to a
     * computationally bounded attacker.)
     */
}